

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20240722::container_internal::
     map_slot_policy<google::protobuf::internal::VariantKey,google::protobuf::internal::NodeBase*>::
     construct<google::protobuf::internal::MapAllocator<std::pair<google::protobuf::internal::VariantKey_const,google::protobuf::internal::NodeBase*>>,std::piecewise_construct_t_const&,std::tuple<google::protobuf::internal::VariantKey&&>,std::tuple<google::protobuf::internal::NodeBase*&>>
               (MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>
                *alloc,slot_type *slot,piecewise_construct_t *args,
               tuple<google::protobuf::internal::VariantKey_&&> *args_1,
               tuple<google::protobuf::internal::NodeBase_*&> *args_2)

{
  tuple<google::protobuf::internal::NodeBase_*&> *args_local_2;
  tuple<google::protobuf::internal::VariantKey_&&> *args_local_1;
  piecewise_construct_t *args_local;
  slot_type *slot_local;
  MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>
  *alloc_local;
  
  map_slot_policy<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>::
  emplace(slot);
  std::
  allocator_traits<google::protobuf::internal::MapAllocator<std::pair<google::protobuf::internal::VariantKey_const,google::protobuf::internal::NodeBase*>>>
  ::
  construct<std::pair<google::protobuf::internal::VariantKey,google::protobuf::internal::NodeBase*>,std::piecewise_construct_t_const&,std::tuple<google::protobuf::internal::VariantKey&&>,std::tuple<google::protobuf::internal::NodeBase*&>>
            (alloc,(pair<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>
                    *)&slot->value,args,args_1,args_2);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args) {
    emplace(slot);
    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
                                                   std::forward<Args>(args)...);
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                   std::forward<Args>(args)...);
    }
  }